

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ObjSetPhase(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  ulong uVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar2 = *(ulong *)pObj;
  uVar4 = (uint)uVar2;
  uVar6 = uVar2 & 0x1fffffff;
  if (uVar6 == 0x1fffffff || (int)uVar4 < 0) {
    if ((int)uVar4 < 0 && (int)uVar6 != 0x1fffffff) {
      uVar6 = uVar2 & 0x7fffffffffffffff |
              (uVar2 << 0x22 ^ *(ulong *)(pObj + -uVar6)) & 0x8000000000000000;
    }
    else {
      uVar6 = uVar2 & 0x7fffffffffffffff;
    }
  }
  else {
    pGVar3 = p->pObjs;
    if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar7 = (uint)(uVar2 >> 0x1d) & 1;
    uVar9 = (uint)(uVar2 >> 0x20);
    uVar5 = uVar9 >> 0x1d & 1;
    uVar10 = -(int)((long)*(undefined8 *)(pObj + -uVar6) >> 0x3f);
    uVar11 = -(int)((long)*(undefined8 *)(pObj + -(ulong)(uVar9 & 0x1fffffff)) >> 0x3f);
    if ((p->pMuxes == (uint *)0x0) ||
       (uVar1 = p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar3) >> 2) * -0x55555555], uVar1 == 0)
       ) {
      uVar7 = uVar7 ^ uVar10;
      uVar5 = uVar5 ^ uVar11;
      if ((uVar4 & 0x1fffffff) < (uVar9 & 0x1fffffff)) {
        uVar5 = uVar5 ^ uVar7;
      }
      else {
        uVar5 = uVar5 & uVar7;
      }
      uVar6 = (ulong)uVar5 << 0x3f;
    }
    else {
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      if (p->nObjs <= (int)(uVar1 >> 1)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar4 = -(int)((long)*(undefined8 *)(pGVar3 + (uVar1 >> 1)) >> 0x3f);
      uVar8 = 0;
      if ((uVar1 & 1) == uVar4) {
        uVar8 = (ulong)(uVar7 != uVar10) << 0x3f;
      }
      uVar6 = 0x8000000000000000;
      if (uVar5 == uVar11) {
        uVar6 = uVar8;
      }
      if ((uVar1 & 1) == uVar4) {
        uVar6 = uVar8;
      }
    }
    uVar6 = uVar2 & 0x7fffffff7fffffff | uVar6;
  }
  *(ulong *)pObj = uVar6;
  return;
}

Assistant:

void Gia_ObjSetPhase( Gia_Man_t * p, Gia_Obj_t * pObj )  
{
    if ( Gia_ObjIsAnd(pObj) )
    {
        int fPhase0 = Gia_ObjPhase(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC0(pObj);
        int fPhase1 = Gia_ObjPhase(Gia_ObjFanin1(pObj)) ^ Gia_ObjFaninC1(pObj);
        if ( Gia_ObjIsMux(p, pObj) )
        {
            int fPhase2 = Gia_ObjPhase(Gia_ObjFanin2(p, pObj)) ^ Gia_ObjFaninC2(p, pObj);
            pObj->fPhase = (fPhase2 && fPhase1) || (!fPhase2 && fPhase0);
        }
        else if ( Gia_ObjIsXor(pObj) )
            pObj->fPhase = fPhase0 ^ fPhase1;
        else
            pObj->fPhase = fPhase0 & fPhase1;
    }
    else if ( Gia_ObjIsCo(pObj) )
        pObj->fPhase = (Gia_ObjPhase(Gia_ObjFanin0(pObj)) ^ Gia_ObjFaninC0(pObj));
    else
        pObj->fPhase = 0;
}